

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O3

void __thiscall antlr::CharScanner::match(CharScanner *this,int c)

{
  int c_00;
  MismatchedCharException *this_00;
  
  c_00 = (*(this->super_TokenStream)._vptr_TokenStream[3])(this,1);
  if (c_00 == c) {
    (*(this->super_TokenStream)._vptr_TokenStream[8])(this);
    return;
  }
  this_00 = (MismatchedCharException *)__cxa_allocate_exception(0x90);
  MismatchedCharException::MismatchedCharException(this_00,c_00,c,false,this);
  __cxa_throw(this_00,&MismatchedCharException::typeinfo,
              MismatchedCharException::~MismatchedCharException);
}

Assistant:

virtual void match(int c)
	{
		int la_1 = LA(1);
		if ( la_1 != c )
			throw MismatchedCharException(la_1, c, false, this);
		consume();
	}